

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

Maybe<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry_&> __thiscall
kj::
Table<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>>
::find<0ul,capnp::Text::Reader&>
          (Table<kj::HashMap<kj::StringPtr,unsigned_short>::Entry,kj::HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>>
           *this,Reader *params)

{
  char *pcVar1;
  ArrayPtr<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry> table;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks> local_28 [8];
  long local_20;
  
  table.ptr = (Entry *)(params + 2);
  pcVar1 = (params->super_StringPtr).content.ptr;
  table.size_ = (size_t)pcVar1;
  HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>::
  find<kj::HashMap<kj::StringPtr,unsigned_short>::Entry_const,capnp::Text::Reader&>
            (local_28,table,
             (Reader *)
             (((long)((params->super_StringPtr).content.size_ - (long)pcVar1) >> 3) *
             -0x5555555555555555));
  if (local_28[0] == (HashIndex<kj::HashMap<kj::StringPtr,unsigned_short>::Callbacks>)0x1) {
    pcVar1 = (params->super_StringPtr).content.ptr + local_20 * 0x18;
  }
  else {
    pcVar1 = (char *)0x0;
  }
  *(char **)this = pcVar1;
  return (Maybe<const_kj::HashMap<kj::StringPtr,_unsigned_short>::Entry_&>)(Entry *)this;
}

Assistant:

kj::Maybe<const Row&> Table<Row, Indexes...>::find(Params&&... params) const {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}